

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

char * glu::getMemoryAccessQualifierName(MemoryAccessQualifier qualifier)

{
  char *pcStack_10;
  MemoryAccessQualifier qualifier_local;
  
  switch(qualifier) {
  case MEMORYACCESSQUALIFIER_COHERENT_BIT:
    pcStack_10 = "coherent";
    break;
  case MEMORYACCESSQUALIFIER_VOLATILE_BIT:
    pcStack_10 = "volatile";
    break;
  default:
    pcStack_10 = (char *)0x0;
    break;
  case MEMORYACCESSQUALIFIER_RESTRICT_BIT:
    pcStack_10 = "restrict";
    break;
  case MEMORYACCESSQUALIFIER_READONLY_BIT:
    pcStack_10 = "readonly";
    break;
  case MEMORYACCESSQUALIFIER_WRITEONLY_BIT:
    pcStack_10 = "writeonly";
  }
  return pcStack_10;
}

Assistant:

const char* getMemoryAccessQualifierName (MemoryAccessQualifier qualifier)
{
	switch (qualifier)
	{
		case MEMORYACCESSQUALIFIER_COHERENT_BIT:	return "coherent";
		case MEMORYACCESSQUALIFIER_VOLATILE_BIT:	return "volatile";
		case MEMORYACCESSQUALIFIER_RESTRICT_BIT:	return "restrict";
		case MEMORYACCESSQUALIFIER_READONLY_BIT:	return "readonly";
		case MEMORYACCESSQUALIFIER_WRITEONLY_BIT:	return "writeonly";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}